

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int read_chunk_bytes(spng_ctx *ctx,uint32_t bytes)

{
  size_t *psVar1;
  ulong uVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = 0x50;
  if (bytes - 1 < ctx->cur_chunk_bytes_left) {
    if ((bytes < 0x2001) || (iVar5 = 0x50, (*(ushort *)&ctx->field_0xcc & 1) == 0)) {
      uVar6 = (ulong)bytes;
      iVar3 = (*(code *)ctx->read_fn)(ctx,ctx->stream_user_ptr,ctx->stream_buf,uVar6);
      if (iVar3 == 0) {
        psVar1 = &ctx->bytes_read;
        uVar2 = *psVar1;
        *psVar1 = *psVar1 + uVar6;
        iVar5 = (uint)CARRY8(uVar2,uVar6) * 3;
      }
      else {
        iVar5 = -2;
        if (iVar3 == -1) {
          iVar5 = -1;
        }
      }
    }
    if (iVar5 == 0) {
      if ((ctx->field_0xcc & 0x80) == 0) {
        uVar4 = crc32(ctx->cur_actual_crc,ctx->data,bytes);
        ctx->cur_actual_crc = uVar4;
      }
      ctx->cur_chunk_bytes_left = ctx->cur_chunk_bytes_left - bytes;
    }
  }
  return iVar5;
}

Assistant:

static int read_chunk_bytes(spng_ctx *ctx, uint32_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!ctx->cur_chunk_bytes_left || !bytes) return SPNG_EINTERNAL;
    if(bytes > ctx->cur_chunk_bytes_left) return SPNG_EINTERNAL; /* XXX: more specific error? */

    int ret;

    ret = read_data(ctx, bytes);
    if(ret) return ret;

    if(!ctx->skip_crc) ctx->cur_actual_crc = crc32(ctx->cur_actual_crc, ctx->data, bytes);

    ctx->cur_chunk_bytes_left -= bytes;

    return ret;
}